

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall
libcellml::ComponentEntity::removeComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  bool bVar1;
  const_iterator __position;
  ComponentImpl *this_00;
  EntityImpl *pEVar2;
  ulong uVar3;
  ComponentEntity local_40;
  
  __position = ComponentEntityImpl::findComponent
                         ((ComponentEntityImpl *)
                          (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,name);
  pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  if (__position._M_current ==
      *(shared_ptr<libcellml::Component> **)((long)&pEVar2[2].mId.field_2 + 8)) {
    if (searchEncapsulated) {
      bVar1 = false;
      for (uVar3 = 0;
          (bVar1 == false &&
          (uVar3 < (ulong)((long)((long)__position._M_current -
                                 pEVar2[2].mId.field_2._M_allocated_capacity) >> 4)));
          uVar3 = uVar3 + 1) {
        component(&local_40,(size_t)this);
        bVar1 = removeComponent((ComponentEntity *)
                                local_40.super_NamedEntity.super_ParentedEntity.super_Entity.
                                _vptr_Entity,name,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        __position._M_current =
             *(shared_ptr<libcellml::Component> **)((long)&pEVar2[2].mId.field_2 + 8);
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    this_00 = Component::pFunc(((__position._M_current)->
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *)&(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.field_2,
            __position);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ComponentEntity::removeComponent(const std::string &name, bool searchEncapsulated)
{
    bool status = false;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        (*result)->pFunc()->removeParent();
        pFunc()->mComponents.erase(result);
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = component(i)->removeComponent(name, searchEncapsulated);
        }
    }

    return status;
}